

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerMSL::emit_header(CompilerMSL *this)

{
  bool bVar1;
  size_type sVar2;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  reference pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *td;
  iterator __end1_2;
  iterator __begin1_2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *header;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__end1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__begin1_1;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *__range1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pragma;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  CompilerMSL *local_10;
  CompilerMSL *this_local;
  
  local_10 = this;
  if ((this->suppress_missing_prototypes & 1U) != 0) {
    CompilerGLSL::statement<char_const(&)[56]>
              (&this->super_CompilerGLSL,
               (char (*) [56])"#pragma clang diagnostic ignored \"-Wmissing-prototypes\"");
  }
  __range1._7_1_ = 0x16;
  sVar2 = ::std::
          set<spirv_cross::CompilerMSL::SPVFuncImpl,_std::less<spirv_cross::CompilerMSL::SPVFuncImpl>,_std::allocator<spirv_cross::CompilerMSL::SPVFuncImpl>_>
          ::count(&this->spv_function_implementations,(key_type *)((long)&__range1 + 7));
  if (sVar2 != 0) {
    CompilerGLSL::statement<char_const(&)[52]>
              (&this->super_CompilerGLSL,
               (char (*) [52])"#pragma clang diagnostic ignored \"-Wmissing-braces\"");
  }
  __end1 = ::std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->pragma_lines);
  pragma = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ::std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->pragma_lines);
  while (bVar1 = ::std::operator!=(&__end1,(_Self *)&pragma), bVar1) {
    pbVar4 = ::std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    CompilerGLSL::statement<std::__cxx11::string_const&>(&this->super_CompilerGLSL,pbVar4);
    ::std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  bVar1 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->pragma_lines);
  if ((!bVar1) || ((this->suppress_missing_prototypes & 1U) != 0)) {
    CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x5df766);
  }
  CompilerGLSL::statement<char_const(&)[24]>
            (&this->super_CompilerGLSL,(char (*) [24])"#include <metal_stdlib>");
  CompilerGLSL::statement<char_const(&)[23]>
            (&this->super_CompilerGLSL,(char (*) [23])"#include <simd/simd.h>");
  this_00 = &(this->super_CompilerGLSL).header_lines;
  __end1_1 = VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::begin(&this_00->
                      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    );
  pbVar3 = VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::end(&this_00->
                  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                );
  for (; __end1_1 != pbVar3; __end1_1 = __end1_1 + 0x20) {
    CompilerGLSL::statement<std::__cxx11::string&>(&this->super_CompilerGLSL,__end1_1);
  }
  CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x5df766);
  CompilerGLSL::statement<char_const(&)[23]>
            (&this->super_CompilerGLSL,(char (*) [23])"using namespace metal;");
  CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x5df766);
  __end1_2 = ::std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->typedef_lines);
  td = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ::std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->typedef_lines);
  while (bVar1 = ::std::operator!=(&__end1_2,(_Self *)&td), bVar1) {
    pbVar4 = ::std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1_2);
    CompilerGLSL::statement<std::__cxx11::string_const&>(&this->super_CompilerGLSL,pbVar4);
    ::std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1_2);
  }
  bVar1 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->typedef_lines);
  if (!bVar1) {
    CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x5df766);
  }
  return;
}

Assistant:

void CompilerMSL::emit_header()
{
	// This particular line can be overridden during compilation, so make it a flag and not a pragma line.
	if (suppress_missing_prototypes)
		statement("#pragma clang diagnostic ignored \"-Wmissing-prototypes\"");

	// Disable warning about missing braces for array<T> template to make arrays a value type
	if (spv_function_implementations.count(SPVFuncImplUnsafeArray) != 0)
		statement("#pragma clang diagnostic ignored \"-Wmissing-braces\"");

	for (auto &pragma : pragma_lines)
		statement(pragma);

	if (!pragma_lines.empty() || suppress_missing_prototypes)
		statement("");

	statement("#include <metal_stdlib>");
	statement("#include <simd/simd.h>");

	for (auto &header : header_lines)
		statement(header);

	statement("");
	statement("using namespace metal;");
	statement("");

	for (auto &td : typedef_lines)
		statement(td);

	if (!typedef_lines.empty())
		statement("");
}